

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

string * __thiscall
flatbuffers::(anonymous_namespace)::GenerateTypeString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region)

{
  size_type *psVar1;
  ulong __val;
  bool bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long *plVar9;
  ulong *puVar10;
  char cVar11;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined1 local_90;
  undefined1 local_8f;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  uVar4 = local_98._4_4_;
  switch(*(undefined4 *)(this + 0x10)) {
  case 0:
    local_98 = 0x745f38746e69753f;
    break;
  case 1:
    local_98 = 0x3374657366664f55;
    goto LAB_00321a53;
  case 2:
    local_98 = 0x3374657366664f53;
LAB_00321a53:
    local_90 = 0x32;
    goto LAB_00321a92;
  case 3:
    local_98 = 0x3174657366664f56;
    local_90 = 0x36;
    goto LAB_00321a92;
  case 4:
    local_98 = CONCAT44(uVar4,0x6c6f6f62);
    goto LAB_00321ade;
  case 5:
  case 8:
    local_98 = CONCAT26(local_98._6_2_,0x745f00000000);
    local_98 = CONCAT44(local_98._4_4_,0x38746e69);
    goto LAB_00321a14;
  case 6:
    local_98 = CONCAT44(uVar4,0x72616863);
    goto LAB_00321ade;
  case 7:
    local_98 = 0x745f38746e6975;
    goto LAB_00321ac6;
  case 9:
    local_98 = 0x745f3631746e6975;
    break;
  case 10:
    local_98 = 0x745f3631746e69;
    goto LAB_00321ac6;
  case 0xb:
    local_98 = 0x745f3233746e6975;
    break;
  case 0xc:
    local_98 = 0x745f3233746e69;
    goto LAB_00321ac6;
  case 0xd:
    local_98 = 0x745f3436746e6975;
    break;
  case 0xe:
    local_98 = 0x745f3436746e69;
LAB_00321ac6:
    local_a0 = 7;
    goto LAB_00321aec;
  case 0xf:
    local_a0 = 5;
    local_98 = CONCAT26(local_98._6_2_,0x74616f6c66);
    goto LAB_00321aec;
  case 0x10:
    local_98 = CONCAT26(local_98._6_2_,0x656c00000000);
    local_98 = CONCAT44(local_98._4_4_,0x62756f64);
    goto LAB_00321a14;
  case 0x11:
    local_98 = CONCAT26(local_98._6_2_,0x386500000000);
    local_98 = CONCAT44(local_98._4_4_,0x70795455);
LAB_00321a14:
    local_a0 = 6;
    local_98._0_7_ = (uint7)(uint6)local_98;
    goto LAB_00321aec;
  case 0x12:
    local_98 = 0x3674657366664f55;
    local_90 = 0x34;
LAB_00321a92:
    local_a0 = 9;
    local_8f = 0;
    goto LAB_00321aec;
  default:
    local_98 = CONCAT44(uVar4,0x6f646f74);
LAB_00321ade:
    local_a0 = 4;
    local_98._0_5_ = (uint5)(uint)local_98;
    goto LAB_00321aec;
  }
  local_a0 = 8;
  local_90 = 0;
LAB_00321aec:
  __val = *(ulong *)(this + 0x18);
  local_a8 = &local_98;
  if (__val == 0) {
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  }
  else {
    cVar11 = '\x01';
    if (9 < __val) {
      uVar8 = __val;
      cVar5 = '\x04';
      do {
        cVar11 = cVar5;
        if (uVar8 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00321b75;
        }
        if (uVar8 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00321b75;
        }
        if (uVar8 < 10000) goto LAB_00321b75;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar5 = cVar11 + '\x04';
      } while (bVar2);
      cVar11 = cVar11 + '\x01';
    }
LAB_00321b75:
    local_48 = local_38;
    std::__cxx11::string::_M_construct((ulong)&local_48,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48,local_40,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x382694);
    local_68 = &local_58;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_58 = *plVar9;
      lStack_50 = plVar6[3];
    }
    else {
      local_58 = *plVar9;
      local_68 = (long *)*plVar6;
    }
    local_60 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_88 = &local_78;
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_78 = *puVar10;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *puVar10;
      local_88 = (ulong *)*plVar6;
    }
    local_80 = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  uVar8 = 0xf;
  if (local_a8 != &local_98) {
    uVar8 = local_98;
  }
  if (uVar8 < (ulong)(local_80 + local_a0)) {
    uVar8 = 0xf;
    if (local_88 != &local_78) {
      uVar8 = local_78;
    }
    if ((ulong)(local_80 + local_a0) <= uVar8) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00321cb0;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
LAB_00321cb0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar3 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (__val != 0) {
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenerateTypeString(const BinaryRegion &region) {
  return ToString(region.type) +
         ((region.array_length)
              ? "[" + std::to_string(region.array_length) + "]"
              : "");
}